

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab *psVar1;
  RtreeSearchPoint *pRVar2;
  RtreeNode *pNode_00;
  int in_EDX;
  Rtree *in_RSI;
  RtreeCursor *in_RDI;
  RtreeNode *pNode;
  int rc;
  RtreeCoord c;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3_context *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc4;
  int local_4;
  
  psVar1 = (in_RDI->base).pVtab;
  pRVar2 = rtreeSearchPointFirst(in_RDI);
  local_4 = 0;
  pNode_00 = rtreeNodeOfFirstSearchPoint
                       ((RtreeCursor *)((ulong)in_stack_ffffffffffffffc4 << 0x20),
                        in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    if (pRVar2 == (RtreeSearchPoint *)0x0) {
      local_4 = 0;
    }
    else {
      if (in_EDX == 0) {
        nodeGetRowid(in_RSI,(RtreeNode *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        sqlite3_result_int64
                  ((sqlite3_context *)in_RSI,
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      else {
        nodeGetCoord((Rtree *)((ulong)in_stack_ffffffffffffffc4 << 0x20),pNode_00,
                     (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                     (RtreeCoord *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (psVar1[1].field_0xd == '\0') {
          sqlite3_result_double
                    (in_stack_ffffffffffffffb0,
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        }
        else {
          sqlite3_result_int(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else{
    if( rc ) return rc;
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }
  return SQLITE_OK;
}